

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuSloppyState::setSubMenuPopup
          (QMenuSloppyState *this,QRect *actionRect,QAction *resetAction,QMenu *subMenu)

{
  bool bVar1;
  long in_FS_OFFSET;
  QRectF local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_init_guard = true;
  this->field_0x6c = this->field_0x6c | 0x21;
  QBasicTimer::stop();
  QRectF::QRectF(&local_50,actionRect);
  (this->m_action_rect).w = local_50.w;
  (this->m_action_rect).h = local_50.h;
  (this->m_action_rect).xp = local_50.xp;
  (this->m_action_rect).yp = local_50.yp;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->m_sub_menu);
  if (bVar1) {
    *(undefined8 *)(*(long *)((this->m_sub_menu).wp.value + 8) + 0x380) = 0;
  }
  QWeakPointer<QObject>::assign<QObject>(&(this->m_sub_menu).wp,(QObject *)subMenu);
  *(QMenuSloppyState **)(*(long *)&(subMenu->super_QWidget).field_0x8 + 0x380) = this;
  this->m_reset_action = resetAction;
  this->m_origin_action = resetAction;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuSloppyState::setSubMenuPopup(const QRect &actionRect, QAction *resetAction, QMenu *subMenu)
{
    m_enabled = true;
    m_init_guard = true;
    m_use_reset_action = true;
    m_time.stop();
    m_action_rect = actionRect;
    if (m_sub_menu)
        QMenuPrivate::get(m_sub_menu)->sloppyState.m_parent = nullptr;
    m_sub_menu = subMenu;
    QMenuPrivate::get(subMenu)->sloppyState.m_parent = this;
    m_reset_action = resetAction;
    m_origin_action = resetAction;
}